

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.hpp
# Opt level: O2

void __thiscall
TridiagonalMatrix::TridiagonalMatrix(TridiagonalMatrix *this,vec *as,vec *bs,vec *cs)

{
  std::vector<double,_std::allocator<double>_>::vector(&this->as,as);
  std::vector<double,_std::allocator<double>_>::vector(&this->bs,bs);
  std::vector<double,_std::allocator<double>_>::vector(&this->cs,cs);
  this->size = (int)((ulong)((long)(as->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                   .super__Vector_impl_data._M_finish -
                            (long)(as->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start) >> 3);
  return;
}

Assistant:

TridiagonalMatrix(const vec& as, const vec& bs, const vec& cs):
        as(as), bs(bs), cs(cs), size(as.size()) {}